

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::cpu_support_arm_edsp(void)

{
  return g_hwcaps & 0x80;
}

Assistant:

int cpu_support_arm_edsp()
{
#if defined __ANDROID__ || defined __linux__
#if __aarch64__
    return 0;
#else
    return g_hwcaps & HWCAP_EDSP;
#endif
#elif __APPLE__
#if __aarch64__
    return 0;
#else
    return g_hw_cputype == CPU_TYPE_ARM;
#endif
#else
    return 0;
#endif
}